

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__create_png_image_raw
              (stbi__png *a,stbi_uc *raw,stbi__uint32 raw_len,int out_n,stbi__uint32 x,
              stbi__uint32 y,int depth,int color)

{
  ushort *puVar1;
  int a_00;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  stbi_uc *psVar8;
  long lVar9;
  uint uVar10;
  long lVar11;
  stbi_uc *psVar12;
  ulong uVar13;
  byte *pbVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  uint uVar22;
  ulong uVar23;
  byte bVar24;
  uint uVar25;
  stbi_uc *psVar27;
  byte *pbVar28;
  byte bVar29;
  uint uVar30;
  long lVar31;
  uint uVar32;
  stbi_uc *psVar33;
  uint uVar34;
  bool bVar35;
  ulong local_58;
  ulong uVar26;
  
  bVar35 = depth == 0x10;
  uVar4 = x * out_n;
  uVar5 = uVar4 << bVar35;
  a_00 = a->s->img_n;
  uVar32 = a_00 << bVar35;
  if (a_00 + 1 != out_n && a_00 != out_n) {
    __assert_fail("out_n == s->img_n || out_n == s->img_n+1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dcoeurjo[P]axisampling/stb_image.h"
                  ,0x1139,
                  "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                 );
  }
  psVar8 = (stbi_uc *)stbi__malloc_mad3(x,y,out_n << bVar35,0);
  a->out = psVar8;
  if (psVar8 == (stbi_uc *)0x0) {
    stbi__g_failure_reason = "outofmem";
  }
  else {
    iVar6 = stbi__mad3sizes_valid(a_00,x,depth,7);
    if (iVar6 == 0) {
      stbi__g_failure_reason = "too large";
    }
    else {
      lVar11 = (long)a_00;
      iVar6 = a_00 * x;
      uVar25 = iVar6 * depth + 7U >> 3;
      uVar26 = (ulong)uVar25;
      if ((uVar25 + 1) * y <= raw_len) {
        if (y != 0) {
          lVar31 = -(ulong)uVar5;
          lVar19 = (long)(out_n << bVar35);
          iVar7 = x - 1;
          lVar9 = -lVar19;
          uVar22 = 0;
          uVar13 = 0;
          local_58 = (ulong)x;
          do {
            pbVar14 = raw + 1;
            bVar2 = *raw;
            if ((ulong)bVar2 < 5) {
              psVar8 = a->out + uVar5 * (int)uVar13;
              if (depth < 8) {
                if (x < uVar25) {
                  __assert_fail("img_width_bytes <= x",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/dcoeurjo[P]axisampling/stb_image.h"
                                ,0x114f,
                                "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                               );
                }
                psVar8 = psVar8 + (uVar4 - uVar25);
                uVar32 = 1;
                local_58 = uVar26;
              }
              bVar3 = bVar2;
              if (uVar13 == 0) {
                bVar3 = ""[bVar2];
              }
              if (0 < (int)uVar32) {
                uVar23 = 0;
                do {
                  switch(bVar3) {
                  case 0:
                  case 1:
                  case 5:
                  case 6:
                    bVar29 = pbVar14[uVar23];
                    goto LAB_0012d602;
                  case 2:
                  case 4:
                    bVar29 = psVar8[uVar23 + lVar31];
                    break;
                  case 3:
                    bVar29 = psVar8[uVar23 + lVar31] >> 1;
                    break;
                  default:
                    goto switchD_0012d5e8_default;
                  }
                  bVar29 = bVar29 + pbVar14[uVar23];
LAB_0012d602:
                  psVar8[uVar23] = bVar29;
switchD_0012d5e8_default:
                  uVar23 = uVar23 + 1;
                } while (uVar32 != uVar23);
              }
              if (depth == 8) {
                lVar21 = (long)out_n;
                lVar20 = lVar11;
                if (a_00 != out_n) {
                  psVar8[lVar11] = 0xff;
                }
LAB_0012d664:
                pbVar14 = pbVar14 + lVar20;
              }
              else {
                if (depth == 0x10) {
                  lVar20 = (long)(int)uVar32;
                  lVar21 = lVar19;
                  if (a_00 != out_n) {
                    (psVar8 + lVar20)[0] = 0xff;
                    (psVar8 + lVar20)[1] = 0xff;
                  }
                  goto LAB_0012d664;
                }
                pbVar14 = raw + 2;
                lVar21 = 1;
              }
              psVar33 = psVar8 + lVar21;
              if (depth < 8 || a_00 == out_n) {
                uVar10 = ((int)local_58 + -1) * uVar32;
                switch(bVar3) {
                case 0:
                  memcpy(psVar33,pbVar14,(long)(int)uVar10);
                  break;
                case 1:
                  if (0 < (int)uVar10) {
                    uVar23 = 0;
                    do {
                      psVar33[uVar23] = psVar8[uVar23 + (lVar21 - (int)uVar32)] + pbVar14[uVar23];
                      uVar23 = uVar23 + 1;
                    } while (uVar10 != uVar23);
                  }
                  break;
                case 2:
                  if (0 < (int)uVar10) {
                    uVar23 = 0;
                    do {
                      psVar33[uVar23] = psVar33[uVar23 + lVar31] + pbVar14[uVar23];
                      uVar23 = uVar23 + 1;
                    } while (uVar10 != uVar23);
                  }
                  break;
                case 3:
                  if (0 < (int)uVar10) {
                    uVar23 = 0;
                    do {
                      psVar33[uVar23] =
                           (char)((uint)psVar8[uVar23 + (lVar21 - (int)uVar32)] +
                                  (uint)psVar33[uVar23 + lVar31] >> 1) + pbVar14[uVar23];
                      uVar23 = uVar23 + 1;
                    } while (uVar10 != uVar23);
                  }
                  break;
                case 4:
                  if (0 < (int)uVar10) {
                    pbVar28 = psVar8 + (lVar21 - (int)uVar32);
                    uVar23 = 0;
                    do {
                      bVar3 = *pbVar28;
                      bVar29 = psVar33[lVar31];
                      bVar24 = pbVar28[lVar31];
                      iVar16 = ((uint)bVar29 + (uint)bVar3) - (uint)bVar24;
                      uVar30 = iVar16 - (uint)bVar3;
                      uVar34 = -uVar30;
                      if (0 < (int)uVar30) {
                        uVar34 = uVar30;
                      }
                      uVar15 = iVar16 - (uint)bVar29;
                      uVar30 = -uVar15;
                      if (0 < (int)uVar15) {
                        uVar30 = uVar15;
                      }
                      uVar17 = iVar16 - (uint)bVar24;
                      uVar15 = -uVar17;
                      if (0 < (int)uVar17) {
                        uVar15 = uVar17;
                      }
                      if (uVar30 <= uVar15) {
                        bVar24 = bVar29;
                      }
                      if (uVar15 < uVar34) {
                        bVar3 = bVar24;
                      }
                      if (uVar30 < uVar34) {
                        bVar3 = bVar24;
                      }
                      *psVar33 = bVar3 + pbVar14[uVar23];
                      uVar23 = uVar23 + 1;
                      pbVar28 = pbVar28 + 1;
                      psVar33 = psVar33 + 1;
                    } while (uVar10 != uVar23);
                  }
                  break;
                case 5:
                  if (0 < (int)uVar10) {
                    uVar23 = 0;
                    do {
                      psVar33[uVar23] =
                           (psVar8[uVar23 + (lVar21 - (int)uVar32)] >> 1) + pbVar14[uVar23];
                      uVar23 = uVar23 + 1;
                    } while (uVar10 != uVar23);
                  }
                  break;
                case 6:
                  if (0 < (int)uVar10) {
                    uVar23 = 0;
                    do {
                      psVar33[uVar23] = psVar8[uVar23 + (lVar21 - (int)uVar32)] + pbVar14[uVar23];
                      uVar23 = uVar23 + 1;
                    } while (uVar10 != uVar23);
                  }
                }
                pbVar14 = pbVar14 + (int)uVar10;
              }
              else {
                if (a_00 + 1 != out_n) {
                  __assert_fail("img_n+1 == out_n",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/dcoeurjo[P]axisampling/stb_image.h"
                                ,0x118d,
                                "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                               );
                }
                switch(bVar3) {
                case 0:
                  if (iVar7 != 0) {
                    iVar16 = iVar7;
                    do {
                      if (0 < (int)uVar32) {
                        uVar23 = 0;
                        do {
                          psVar33[uVar23] = pbVar14[uVar23];
                          uVar23 = uVar23 + 1;
                        } while (uVar32 != uVar23);
                      }
                      psVar33[(int)uVar32] = 0xff;
                      pbVar14 = pbVar14 + (int)uVar32;
                      psVar33 = psVar33 + lVar19;
                      iVar16 = iVar16 + -1;
                    } while (iVar16 != 0);
                  }
                  break;
                case 1:
                  if (iVar7 != 0) {
                    psVar8 = psVar8 + lVar21 + lVar9;
                    iVar16 = iVar7;
                    do {
                      if (0 < (int)uVar32) {
                        uVar23 = 0;
                        do {
                          psVar33[uVar23] = psVar8[uVar23] + pbVar14[uVar23];
                          uVar23 = uVar23 + 1;
                        } while (uVar32 != uVar23);
                      }
                      psVar33[(int)uVar32] = 0xff;
                      pbVar14 = pbVar14 + (int)uVar32;
                      psVar33 = psVar33 + lVar19;
                      psVar8 = psVar8 + lVar19;
                      iVar16 = iVar16 + -1;
                    } while (iVar16 != 0);
                  }
                  break;
                case 2:
                  if (iVar7 != 0) {
                    iVar16 = iVar7;
                    do {
                      if (0 < (int)uVar32) {
                        uVar23 = 0;
                        do {
                          psVar33[uVar23] = psVar33[uVar23 + lVar31] + pbVar14[uVar23];
                          uVar23 = uVar23 + 1;
                        } while (uVar32 != uVar23);
                      }
                      psVar33[(int)uVar32] = 0xff;
                      pbVar14 = pbVar14 + (int)uVar32;
                      psVar33 = psVar33 + lVar19;
                      iVar16 = iVar16 + -1;
                    } while (iVar16 != 0);
                  }
                  break;
                case 3:
                  if (iVar7 != 0) {
                    iVar16 = iVar7;
                    do {
                      if (0 < (int)uVar32) {
                        uVar23 = 0;
                        psVar8 = psVar33;
                        do {
                          *psVar8 = (char)((uint)psVar8[lVar9] + (uint)psVar8[lVar31] >> 1) +
                                    pbVar14[uVar23];
                          uVar23 = uVar23 + 1;
                          psVar8 = psVar8 + 1;
                        } while (uVar32 != uVar23);
                      }
                      psVar33[(int)uVar32] = 0xff;
                      pbVar14 = pbVar14 + (int)uVar32;
                      psVar33 = psVar33 + lVar19;
                      iVar16 = iVar16 + -1;
                    } while (iVar16 != 0);
                  }
                  break;
                case 4:
                  if (iVar7 != 0) {
                    psVar12 = psVar8 + lVar21 + lVar31;
                    psVar27 = psVar8 + lVar21 + lVar9;
                    psVar8 = psVar8 + lVar21 + (lVar9 - (ulong)uVar5);
                    iVar16 = iVar7;
                    do {
                      if (0 < (int)uVar32) {
                        uVar23 = 0;
                        do {
                          bVar3 = psVar27[uVar23];
                          bVar29 = psVar12[uVar23];
                          bVar24 = psVar8[uVar23];
                          iVar18 = ((uint)bVar29 + (uint)bVar3) - (uint)bVar24;
                          uVar34 = iVar18 - (uint)bVar3;
                          uVar10 = -uVar34;
                          if (0 < (int)uVar34) {
                            uVar10 = uVar34;
                          }
                          uVar30 = iVar18 - (uint)bVar29;
                          uVar34 = -uVar30;
                          if (0 < (int)uVar30) {
                            uVar34 = uVar30;
                          }
                          uVar15 = iVar18 - (uint)bVar24;
                          uVar30 = -uVar15;
                          if (0 < (int)uVar15) {
                            uVar30 = uVar15;
                          }
                          if (uVar34 <= uVar30) {
                            bVar24 = bVar29;
                          }
                          if (uVar30 < uVar10) {
                            bVar3 = bVar24;
                          }
                          if (uVar34 < uVar10) {
                            bVar3 = bVar24;
                          }
                          psVar33[uVar23] = bVar3 + pbVar14[uVar23];
                          uVar23 = uVar23 + 1;
                        } while (uVar32 != uVar23);
                      }
                      psVar33[(int)uVar32] = 0xff;
                      pbVar14 = pbVar14 + (int)uVar32;
                      psVar33 = psVar33 + lVar19;
                      psVar12 = psVar12 + lVar19;
                      psVar27 = psVar27 + lVar19;
                      psVar8 = psVar8 + lVar19;
                      iVar16 = iVar16 + -1;
                    } while (iVar16 != 0);
                  }
                  break;
                case 5:
                  if (iVar7 != 0) {
                    psVar8 = psVar8 + lVar21 + lVar9;
                    iVar16 = iVar7;
                    do {
                      if (0 < (int)uVar32) {
                        uVar23 = 0;
                        do {
                          psVar33[uVar23] = (psVar8[uVar23] >> 1) + pbVar14[uVar23];
                          uVar23 = uVar23 + 1;
                        } while (uVar32 != uVar23);
                      }
                      psVar33[(int)uVar32] = 0xff;
                      pbVar14 = pbVar14 + (int)uVar32;
                      psVar33 = psVar33 + lVar19;
                      psVar8 = psVar8 + lVar19;
                      iVar16 = iVar16 + -1;
                    } while (iVar16 != 0);
                  }
                  break;
                case 6:
                  if (iVar7 != 0) {
                    psVar8 = psVar8 + lVar21 + lVar9;
                    iVar16 = iVar7;
                    do {
                      if (0 < (int)uVar32) {
                        uVar23 = 0;
                        do {
                          psVar33[uVar23] = psVar8[uVar23] + pbVar14[uVar23];
                          uVar23 = uVar23 + 1;
                        } while (uVar32 != uVar23);
                      }
                      psVar33[(int)uVar32] = 0xff;
                      pbVar14 = pbVar14 + (int)uVar32;
                      psVar33 = psVar33 + lVar19;
                      psVar8 = psVar8 + lVar19;
                      iVar16 = iVar16 + -1;
                    } while (iVar16 != 0);
                  }
                }
                if (x != 0 && depth == 0x10) {
                  psVar8 = a->out + (long)(int)uVar32 + (ulong)uVar22 + 1;
                  uVar23 = (ulong)x;
                  do {
                    *psVar8 = 0xff;
                    psVar8 = psVar8 + lVar19;
                    uVar10 = (int)uVar23 - 1;
                    uVar23 = (ulong)uVar10;
                  } while (uVar10 != 0);
                }
              }
            }
            else {
              stbi__g_failure_reason = "invalid filter";
            }
            if (4 < bVar2) {
              return 0;
            }
            uVar13 = uVar13 + 1;
            uVar22 = uVar22 + uVar5;
            raw = pbVar14;
          } while (uVar13 != y);
        }
        if (7 < depth) {
          if (depth != 0x10) {
            return 1;
          }
          if (uVar4 * y != 0) {
            psVar8 = a->out;
            lVar11 = 0;
            do {
              puVar1 = (ushort *)(psVar8 + lVar11 * 2);
              *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
              lVar11 = lVar11 + 1;
            } while (uVar4 * y != (int)lVar11);
            return 1;
          }
          return 1;
        }
        if (y == 0) {
          return 1;
        }
        uVar32 = x - 1;
        lVar11 = uVar4 - uVar26;
        lVar9 = (ulong)uVar32 + 1;
        uVar25 = 0;
        uVar13 = 0;
        do {
          bVar2 = 1;
          if (color == 0) {
            bVar2 = ""[depth];
          }
          psVar8 = a->out;
          pbVar28 = psVar8 + uVar5 * (int)uVar13;
          pbVar14 = pbVar28 + (uVar4 - uVar26);
          uVar23 = (ulong)uVar25;
          if (depth == 4) {
            iVar7 = iVar6;
            if (1 < iVar6) {
              psVar33 = psVar8 + lVar11;
              iVar16 = iVar6;
              do {
                psVar8[uVar23] = (psVar33[uVar23] >> 4) * bVar2;
                psVar8[uVar23 + 1] = (psVar33[uVar23] & 0xf) * bVar2;
                iVar7 = iVar16 + -2;
                psVar33 = psVar33 + 1;
                psVar8 = psVar8 + 2;
                bVar35 = 3 < iVar16;
                iVar16 = iVar7;
              } while (bVar35);
              pbVar14 = psVar33 + uVar23;
              pbVar28 = psVar8 + uVar23;
            }
            if (iVar7 == 1) {
              bVar3 = *pbVar14 >> 4;
LAB_0012debf:
              bVar2 = bVar3 * bVar2;
LAB_0012dec2:
              *pbVar28 = bVar2;
            }
          }
          else if (depth == 2) {
            iVar7 = iVar6;
            if (3 < iVar6) {
              psVar33 = psVar8 + lVar11;
              iVar16 = iVar6;
              do {
                psVar8[uVar23] = (psVar33[uVar23] >> 6) * bVar2;
                psVar8[uVar23 + 1] = (psVar33[uVar23] >> 4 & 3) * bVar2;
                psVar8[uVar23 + 2] = (psVar33[uVar23] >> 2 & 3) * bVar2;
                psVar8[uVar23 + 3] = (psVar33[uVar23] & 3) * bVar2;
                iVar7 = iVar16 + -4;
                psVar33 = psVar33 + 1;
                psVar8 = psVar8 + 4;
                bVar35 = 7 < iVar16;
                iVar16 = iVar7;
              } while (bVar35);
              pbVar14 = psVar33 + uVar23;
              pbVar28 = psVar8 + uVar23;
            }
            if (0 < iVar7) {
              *pbVar28 = (*pbVar14 >> 6) * bVar2;
              pbVar28 = pbVar28 + 1;
            }
            if (1 < iVar7) {
              *pbVar28 = (*pbVar14 >> 4 & 3) * bVar2;
              pbVar28 = pbVar28 + 1;
            }
            if (iVar7 == 3) {
              bVar3 = *pbVar14 >> 2 & 3;
              goto LAB_0012debf;
            }
          }
          else if (depth == 1) {
            iVar7 = iVar6;
            if (7 < iVar6) {
              psVar33 = psVar8 + lVar11;
              iVar16 = iVar6;
              do {
                psVar8[uVar23] = (char)psVar33[uVar23] >> 7 & bVar2;
                psVar8[uVar23 + 1] = (char)(psVar33[uVar23] * '\x02') >> 7 & bVar2;
                psVar8[uVar23 + 2] = (char)(psVar33[uVar23] << 2) >> 7 & bVar2;
                psVar8[uVar23 + 3] = (char)(psVar33[uVar23] << 3) >> 7 & bVar2;
                psVar8[uVar23 + 4] = (char)(psVar33[uVar23] << 4) >> 7 & bVar2;
                psVar8[uVar23 + 5] = (char)(psVar33[uVar23] << 5) >> 7 & bVar2;
                psVar8[uVar23 + 6] = (char)(psVar33[uVar23] << 6) >> 7 & bVar2;
                bVar3 = bVar2;
                if ((psVar33[uVar23] & 1) == 0) {
                  bVar3 = 0;
                }
                psVar8[uVar23 + 7] = bVar3;
                iVar7 = iVar16 + -8;
                psVar33 = psVar33 + 1;
                psVar8 = psVar8 + 8;
                bVar35 = 0xf < iVar16;
                iVar16 = iVar7;
              } while (bVar35);
              pbVar14 = psVar33 + uVar23;
              pbVar28 = psVar8 + uVar23;
            }
            if (0 < iVar7) {
              *pbVar28 = (char)*pbVar14 >> 7 & bVar2;
              pbVar28 = pbVar28 + 1;
            }
            if (1 < iVar7) {
              *pbVar28 = (char)(*pbVar14 * '\x02') >> 7 & bVar2;
              pbVar28 = pbVar28 + 1;
            }
            if (2 < iVar7) {
              *pbVar28 = (char)(*pbVar14 << 2) >> 7 & bVar2;
              pbVar28 = pbVar28 + 1;
            }
            if (3 < iVar7) {
              *pbVar28 = (char)(*pbVar14 << 3) >> 7 & bVar2;
              pbVar28 = pbVar28 + 1;
            }
            if (4 < iVar7) {
              *pbVar28 = (char)(*pbVar14 << 4) >> 7 & bVar2;
              pbVar28 = pbVar28 + 1;
            }
            if (5 < iVar7) {
              *pbVar28 = (char)(*pbVar14 << 5) >> 7 & bVar2;
              pbVar28 = pbVar28 + 1;
            }
            if (iVar7 == 7) {
              bVar2 = (char)(*pbVar14 << 6) >> 7 & bVar2;
              goto LAB_0012dec2;
            }
          }
          if (a_00 != out_n) {
            psVar8 = a->out;
            if (a_00 == 1) {
              lVar19 = lVar9;
              if (-1 < (int)uVar32) {
                do {
                  psVar8[lVar19 * 2 + (uVar23 - 1)] = 0xff;
                  psVar8[lVar19 * 2 + (uVar23 - 2)] = psVar8[lVar19 + (uVar23 - 1)];
                  lVar31 = lVar19 + -1;
                  bVar35 = 0 < lVar19;
                  lVar19 = lVar31;
                } while (lVar31 != 0 && bVar35);
              }
            }
            else {
              if (a_00 != 3) {
                __assert_fail("img_n == 3",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/dcoeurjo[P]axisampling/stb_image.h"
                              ,0x11e6,
                              "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                             );
              }
              if (-1 < (int)uVar32) {
                psVar33 = psVar8 + (ulong)uVar32 * 3 + 2 + uVar23;
                lVar19 = lVar9;
                do {
                  psVar8[lVar19 * 4 + (uVar23 - 1)] = 0xff;
                  psVar8[lVar19 * 4 + (uVar23 - 2)] = *psVar33;
                  psVar8[lVar19 * 4 + (uVar23 - 3)] = psVar33[-1];
                  psVar8[lVar19 * 4 + (uVar23 - 4)] = psVar33[-2];
                  psVar33 = psVar33 + -3;
                  lVar31 = lVar19 + -1;
                  bVar35 = 0 < lVar19;
                  lVar19 = lVar31;
                } while (lVar31 != 0 && bVar35);
              }
            }
          }
          uVar13 = uVar13 + 1;
          uVar25 = uVar25 + uVar5;
          if (uVar13 == y) {
            return 1;
          }
        } while( true );
      }
      stbi__g_failure_reason = "not enough pixels";
    }
  }
  return 0;
}

Assistant:

static int stbi__create_png_image_raw(stbi__png *a, stbi_uc *raw, stbi__uint32 raw_len, int out_n, stbi__uint32 x, stbi__uint32 y, int depth, int color)
{
   int bytes = (depth == 16? 2 : 1);
   stbi__context *s = a->s;
   stbi__uint32 i,j,stride = x*out_n*bytes;
   stbi__uint32 img_len, img_width_bytes;
   int k;
   int img_n = s->img_n; // copy it into a local for later

   int output_bytes = out_n*bytes;
   int filter_bytes = img_n*bytes;
   int width = x;

   STBI_ASSERT(out_n == s->img_n || out_n == s->img_n+1);
   a->out = (stbi_uc *) stbi__malloc_mad3(x, y, output_bytes, 0); // extra bytes to write off the end into
   if (!a->out) return stbi__err("outofmem", "Out of memory");

   if (!stbi__mad3sizes_valid(img_n, x, depth, 7)) return stbi__err("too large", "Corrupt PNG");
   img_width_bytes = (((img_n * x * depth) + 7) >> 3);
   img_len = (img_width_bytes + 1) * y;

   // we used to check for exact match between raw_len and img_len on non-interlaced PNGs,
   // but issue #276 reported a PNG in the wild that had extra data at the end (all zeros),
   // so just check for raw_len < img_len always.
   if (raw_len < img_len) return stbi__err("not enough pixels","Corrupt PNG");

   for (j=0; j < y; ++j) {
      stbi_uc *cur = a->out + stride*j;
      stbi_uc *prior;
      int filter = *raw++;

      if (filter > 4)
         return stbi__err("invalid filter","Corrupt PNG");

      if (depth < 8) {
         STBI_ASSERT(img_width_bytes <= x);
         cur += x*out_n - img_width_bytes; // store output to the rightmost img_len bytes, so we can decode in place
         filter_bytes = 1;
         width = img_width_bytes;
      }
      prior = cur - stride; // bugfix: need to compute this after 'cur +=' computation above

      // if first row, use special filter that doesn't sample previous row
      if (j == 0) filter = first_row_filter[filter];

      // handle first byte explicitly
      for (k=0; k < filter_bytes; ++k) {
         switch (filter) {
            case STBI__F_none       : cur[k] = raw[k]; break;
            case STBI__F_sub        : cur[k] = raw[k]; break;
            case STBI__F_up         : cur[k] = STBI__BYTECAST(raw[k] + prior[k]); break;
            case STBI__F_avg        : cur[k] = STBI__BYTECAST(raw[k] + (prior[k]>>1)); break;
            case STBI__F_paeth      : cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(0,prior[k],0)); break;
            case STBI__F_avg_first  : cur[k] = raw[k]; break;
            case STBI__F_paeth_first: cur[k] = raw[k]; break;
         }
      }

      if (depth == 8) {
         if (img_n != out_n)
            cur[img_n] = 255; // first pixel
         raw += img_n;
         cur += out_n;
         prior += out_n;
      } else if (depth == 16) {
         if (img_n != out_n) {
            cur[filter_bytes]   = 255; // first pixel top byte
            cur[filter_bytes+1] = 255; // first pixel bottom byte
         }
         raw += filter_bytes;
         cur += output_bytes;
         prior += output_bytes;
      } else {
         raw += 1;
         cur += 1;
         prior += 1;
      }

      // this is a little gross, so that we don't switch per-pixel or per-component
      if (depth < 8 || img_n == out_n) {
         int nk = (width - 1)*filter_bytes;
         #define STBI__CASE(f) \
             case f:     \
                for (k=0; k < nk; ++k)
         switch (filter) {
            // "none" filter turns into a memcpy here; make that explicit.
            case STBI__F_none:         memcpy(cur, raw, nk); break;
            STBI__CASE(STBI__F_sub)          { cur[k] = STBI__BYTECAST(raw[k] + cur[k-filter_bytes]); } break;
            STBI__CASE(STBI__F_up)           { cur[k] = STBI__BYTECAST(raw[k] + prior[k]); } break;
            STBI__CASE(STBI__F_avg)          { cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k-filter_bytes])>>1)); } break;
            STBI__CASE(STBI__F_paeth)        { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],prior[k],prior[k-filter_bytes])); } break;
            STBI__CASE(STBI__F_avg_first)    { cur[k] = STBI__BYTECAST(raw[k] + (cur[k-filter_bytes] >> 1)); } break;
            STBI__CASE(STBI__F_paeth_first)  { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],0,0)); } break;
         }
         #undef STBI__CASE
         raw += nk;
      } else {
         STBI_ASSERT(img_n+1 == out_n);
         #define STBI__CASE(f) \
             case f:     \
                for (i=x-1; i >= 1; --i, cur[filter_bytes]=255,raw+=filter_bytes,cur+=output_bytes,prior+=output_bytes) \
                   for (k=0; k < filter_bytes; ++k)
         switch (filter) {
            STBI__CASE(STBI__F_none)         { cur[k] = raw[k]; } break;
            STBI__CASE(STBI__F_sub)          { cur[k] = STBI__BYTECAST(raw[k] + cur[k- output_bytes]); } break;
            STBI__CASE(STBI__F_up)           { cur[k] = STBI__BYTECAST(raw[k] + prior[k]); } break;
            STBI__CASE(STBI__F_avg)          { cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k- output_bytes])>>1)); } break;
            STBI__CASE(STBI__F_paeth)        { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k- output_bytes],prior[k],prior[k- output_bytes])); } break;
            STBI__CASE(STBI__F_avg_first)    { cur[k] = STBI__BYTECAST(raw[k] + (cur[k- output_bytes] >> 1)); } break;
            STBI__CASE(STBI__F_paeth_first)  { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k- output_bytes],0,0)); } break;
         }
         #undef STBI__CASE

         // the loop above sets the high byte of the pixels' alpha, but for
         // 16 bit png files we also need the low byte set. we'll do that here.
         if (depth == 16) {
            cur = a->out + stride*j; // start at the beginning of the row again
            for (i=0; i < x; ++i,cur+=output_bytes) {
               cur[filter_bytes+1] = 255;
            }
         }
      }